

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

llama_sampler *
llama_sampler_init_mirostat(int32_t n_vocab,uint32_t seed,float tau,float eta,int32_t m)

{
  uint32_t uVar1;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *this;
  llama_sampler *plVar2;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined4 in_EDI;
  float in_XMM0_Da;
  undefined4 in_XMM1_Da;
  uint32_t seed_cur;
  uint32_t in_stack_00002700;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *iface;
  
  uVar1 = get_rng_seed(in_stack_00002700);
  this = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)operator_new(0x13a8);
  *(undefined4 *)this->_M_x = in_EDI;
  *(undefined4 *)((long)this->_M_x + 4) = in_ESI;
  *(uint32_t *)(this->_M_x + 1) = uVar1;
  *(float *)((long)this->_M_x + 0xc) = in_XMM0_Da;
  *(undefined4 *)(this->_M_x + 2) = in_XMM1_Da;
  *(undefined4 *)((long)this->_M_x + 0x14) = in_EDX;
  *(float *)(this->_M_x + 3) = in_XMM0_Da + in_XMM0_Da;
  iface = this;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(this,(result_type)this);
  plVar2 = llama_sampler_init((llama_sampler_i *)iface,this);
  return plVar2;
}

Assistant:

struct llama_sampler * llama_sampler_init_mirostat(int32_t n_vocab, uint32_t seed, float tau, float eta, int32_t m) {
    auto seed_cur = get_rng_seed(seed);
    return llama_sampler_init(
        /* .iface = */ &llama_sampler_mirostat_i,
        /* .ctx   = */ new llama_sampler_mirostat {
            /* .n_vocab  = */ n_vocab,
            /* .seed     = */ seed,
            /* .seed_cur = */ seed_cur,
            /* .tau      = */ tau,
            /* .eta      = */ eta,
            /* .m        = */ m,
            /* .mu       = */ 2.0f*tau,
            /* .rng      = */ std::mt19937(seed_cur),
        }
    );
}